

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MAW.cpp
# Opt level: O2

void __thiscall OpenMD::MAW::initialize(MAW *this)

{
  vector<int,_std::allocator<int>_> *this_00;
  pointer piVar1;
  ForceField *pFVar2;
  pointer pcVar3;
  size_t sVar4;
  undefined8 uVar5;
  bool bVar6;
  AtomType *this_01;
  AtomType *this_02;
  long lVar7;
  NonBondedInteractionType *this_03;
  TypeContainer<OpenMD::NonBondedInteractionType,_2> *this_04;
  int atid2;
  int atid1;
  KeyType keys;
  int local_a8;
  int local_a4;
  MapTypeIterator local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *local_80;
  TypeContainer<OpenMD::NonBondedInteractionType,_2> *local_78;
  string local_70;
  string local_50;
  
  local_80 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &this->MAWtypes;
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::clear
            ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
             local_80);
  this_00 = &this->MAWtids;
  piVar1 = (this->MAWtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->MAWtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar1) {
    (this->MAWtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar1;
  }
  std::
  vector<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>,_std::allocator<std::vector<OpenMD::MAWInteractionData,_std::allocator<OpenMD::MAWInteractionData>_>_>_>
  ::clear(&this->MixingMap);
  local_70._M_dataplus._M_p._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::resize
            (this_00,(this->forceField_->atomTypeCont_).data_._M_t._M_impl.super__Rb_tree_header.
                     _M_node_count,(value_type_conflict *)&local_70);
  pFVar2 = this->forceField_;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_98.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a0._M_node =
       (pFVar2->nonBondedInteractionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header._M_header.
       _M_left;
  if ((_Rb_tree_header *)local_a0._M_node ==
      &(pFVar2->nonBondedInteractionTypeCont_).data_._M_t._M_impl.super__Rb_tree_header) {
    this_03 = (NonBondedInteractionType *)0x0;
  }
  else {
    this_03 = *(NonBondedInteractionType **)(local_a0._M_node + 2);
  }
  this_04 = &pFVar2->nonBondedInteractionTypeCont_;
  local_78 = this_04;
  while (this_03 != (NonBondedInteractionType *)0x0) {
    bVar6 = NonBondedInteractionType::isMAW(this_03);
    if (bVar6) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_70,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_a0._M_node + 1));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&local_98,&local_70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_70);
      this_01 = ForceField::getAtomType
                          (this->forceField_,
                           local_98.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      if (this_01 == (AtomType *)0x0) {
        pcVar3 = ((local_98.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
        snprintf(painCave.errMsg,2000,
                 "MAW::initialize could not find AtomType %s\n\tto for for %s - %s interaction.\n",
                 pcVar3,pcVar3,
                 local_98.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      this_02 = ForceField::getAtomType
                          (this->forceField_,
                           local_98.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 1);
      if (this_02 == (AtomType *)0x0) {
        pcVar3 = local_98.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        snprintf(painCave.errMsg,2000,
                 "MAW::initialize could not find AtomType %s\n\tfor %s - %s nonbonded interaction.\n"
                 ,pcVar3,((local_98.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p,pcVar3);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      local_a4 = AtomType::getIdent(this_01);
      if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[local_a4] == -1) {
        sVar4 = (this->MAWtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>(local_80,&local_a4);
        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[local_a4] = (int)sVar4;
      }
      local_a8 = AtomType::getIdent(this_02);
      if ((this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_start[local_a8] == -1) {
        sVar4 = (this->MAWtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>(local_80,&local_a8);
        (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[local_a8] = (int)sVar4;
      }
      lVar7 = __dynamic_cast(this_03,&NonBondedInteractionType::typeinfo,
                             &MAWInteractionType::typeinfo,0);
      if (lVar7 == 0) {
        AtomType::getName_abi_cxx11_(&local_70,this_01);
        uVar5 = CONCAT44(local_70._M_dataplus._M_p._4_4_,local_70._M_dataplus._M_p._0_4_);
        AtomType::getName_abi_cxx11_(&local_50,this_02);
        snprintf(painCave.errMsg,2000,
                 "MAW::initialize could not convert NonBondedInteractionType\n\tto MAWInteractionType for %s - %s interaction.\n"
                 ,uVar5,local_50._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_70);
        painCave.isFatal = 1;
        painCave.severity = 1;
        simError();
      }
      addExplicitInteraction
                (this,this_01,this_02,*(RealType *)(lVar7 + 0x60),*(RealType *)(lVar7 + 0x68),
                 *(RealType *)(lVar7 + 0x70),*(RealType *)(lVar7 + 0x78),*(RealType *)(lVar7 + 0x80)
                );
      this_04 = local_78;
    }
    this_03 = TypeContainer<OpenMD::NonBondedInteractionType,_2>::nextType(this_04,&local_a0);
  }
  this->initialized_ = true;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_98);
  return;
}

Assistant:

void MAW::initialize() {
    MAWtypes.clear();
    MAWtids.clear();
    MixingMap.clear();
    MAWtids.resize(forceField_->getNAtomType(), -1);

    ForceField::NonBondedInteractionTypeContainer* nbiTypes =
        forceField_->getNonBondedInteractionTypes();
    ForceField::NonBondedInteractionTypeContainer::MapTypeIterator j;
    ForceField::NonBondedInteractionTypeContainer::KeyType keys;
    NonBondedInteractionType* nbt;
    int mtid1, mtid2;

    for (nbt = nbiTypes->beginType(j); nbt != NULL;
         nbt = nbiTypes->nextType(j)) {
      if (nbt->isMAW()) {
        keys          = nbiTypes->getKeys(j);
        AtomType* at1 = forceField_->getAtomType(keys[0]);
        if (at1 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "MAW::initialize could not find AtomType %s\n"
                   "\tto for for %s - %s interaction.\n",
                   keys[0].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        AtomType* at2 = forceField_->getAtomType(keys[1]);
        if (at2 == NULL) {
          snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                   "MAW::initialize could not find AtomType %s\n"
                   "\tfor %s - %s nonbonded interaction.\n",
                   keys[1].c_str(), keys[0].c_str(), keys[1].c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        int atid1 = at1->getIdent();
        if (MAWtids[atid1] == -1) {
          mtid1 = MAWtypes.size();
          MAWtypes.insert(atid1);
          MAWtids[atid1] = mtid1;
        }
        int atid2 = at2->getIdent();
        if (MAWtids[atid2] == -1) {
          mtid2 = MAWtypes.size();
          MAWtypes.insert(atid2);
          MAWtids[atid2] = mtid2;
        }

        MAWInteractionType* mit = dynamic_cast<MAWInteractionType*>(nbt);

        if (mit == NULL) {
          snprintf(
              painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
              "MAW::initialize could not convert NonBondedInteractionType\n"
              "\tto MAWInteractionType for %s - %s interaction.\n",
              at1->getName().c_str(), at2->getName().c_str());
          painCave.severity = OPENMD_ERROR;
          painCave.isFatal  = 1;
          simError();
        }

        RealType De   = mit->getD();
        RealType beta = mit->getBeta();
        RealType Re   = mit->getR();
        RealType ca1  = mit->getCA1();
        RealType cb1  = mit->getCB1();

        addExplicitInteraction(at1, at2, De, beta, Re, ca1, cb1);
      }
    }
    initialized_ = true;
  }